

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void wabt::anon_unknown_0::CWriter::SerializeFuncType(FuncType *func_type,string *serialized_type)

{
  Type TVar1;
  long lVar2;
  string *psVar3;
  wabt *this;
  char cVar4;
  pointer pTVar5;
  pointer pTVar6;
  string *digest;
  Index i;
  ulong uVar7;
  size_t sVar8;
  Index i_1;
  string *psVar9;
  string_view input;
  undefined8 uStack_50;
  undefined8 local_48;
  string *local_40;
  wabt *local_38;
  
  pTVar5 = (func_type->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar6 = (func_type->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_48 = ((ulong)((long)pTVar6 - (long)pTVar5) >> 3) +
             ((ulong)((long)(func_type->sig).result_types.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(func_type->sig).result_types.
                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3) + 1;
  local_38 = (wabt *)(local_48 & 0xffffffff);
  lVar2 = -((ulong)(local_38 + 0xf) & 0xfffffffffffffff0);
  sVar8 = (long)&local_48 + lVar2;
  local_40 = serialized_type;
  for (uVar7 = 0; uVar7 < ((ulong)((long)pTVar6 - (long)pTVar5) >> 3 & 0xffffffff);
      uVar7 = uVar7 + 1) {
    TVar1 = pTVar5[uVar7];
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x19436e;
    cVar4 = MangleType(TVar1);
    *(char *)(sVar8 + uVar7) = cVar4;
    pTVar5 = (func_type->sig).param_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    pTVar6 = (func_type->sig).param_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  *(undefined1 *)(sVar8 + uVar7) = 0x20;
  psVar9 = (string *)0x0;
  while( true ) {
    this = local_38;
    psVar3 = local_40;
    pTVar5 = (func_type->sig).result_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    digest = (string *)
             ((ulong)((long)(func_type->sig).result_types.
                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pTVar5) >> 3 & 0xffffffff);
    if (digest <= psVar9) break;
    TVar1 = pTVar5[(long)psVar9];
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1943aa;
    cVar4 = MangleType(TVar1);
    *(char *)((long)psVar9 + uVar7 + sVar8 + 1) = cVar4;
    psVar9 = (string *)((long)&(psVar9->_M_dataplus)._M_p + 1);
  }
  if ((uVar7 - (local_48 & 0xffffffff)) + (long)psVar9 == -1) {
    *(undefined8 *)((long)&uStack_50 + lVar2) = 0x1943d3;
    input._M_str = (char *)psVar3;
    input._M_len = sVar8;
    sha256(this,input,digest);
    return;
  }
  *(undefined8 *)((long)&uStack_50 + lVar2) = 0x194401;
  __assert_fail("next_byte - mangled_signature == len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x558,
                "static void wabt::(anonymous namespace)::CWriter::SerializeFuncType(const FuncType &, std::string &)"
               );
}

Assistant:

void CWriter::SerializeFuncType(const FuncType& func_type,
                                std::string& serialized_type) {
  unsigned int len = func_type.GetNumParams() + func_type.GetNumResults() + 1;

  char* const mangled_signature = static_cast<char*>(alloca(len));
  char* next_byte = mangled_signature;

  // step 1: serialize each param type
  for (Index i = 0; i < func_type.GetNumParams(); ++i) {
    *next_byte++ = MangleType(func_type.GetParamType(i));
  }

  // step 2: separate params and results with a space
  *next_byte++ = ' ';

  // step 3: serialize each result type
  for (Index i = 0; i < func_type.GetNumResults(); ++i) {
    *next_byte++ = MangleType(func_type.GetResultType(i));
  }

  assert(next_byte - mangled_signature == len);

  // step 4: SHA-256 the whole string
  sha256({mangled_signature, len}, serialized_type);
}